

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::RenameFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>const&,std::__cxx11::string_const&>
          (duckdb *this,AlterEntryData *args,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_1,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  RenameFieldInfo *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d0;
  AlterEntryData local_b8;
  string local_50;
  
  this_00 = (RenameFieldInfo *)operator_new(0xb0);
  paVar2 = &local_b8.catalog.field_2;
  local_b8.catalog._M_dataplus._M_p = (args->catalog)._M_dataplus._M_p;
  paVar1 = &(args->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.catalog._M_dataplus._M_p == paVar1) {
    local_b8.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.catalog.field_2._8_8_ = *(undefined8 *)((long)&(args->catalog).field_2 + 8);
    local_b8.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b8.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b8.catalog._M_string_length = (args->catalog)._M_string_length;
  local_b8.schema._M_dataplus._M_p = (pointer)&local_b8.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->schema)._M_dataplus._M_p;
  paVar1 = &(args->schema).field_2;
  if (paVar3 == paVar1) {
    local_b8.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.schema.field_2._8_8_ = *(undefined8 *)((long)&(args->schema).field_2 + 8);
  }
  else {
    local_b8.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  local_b8.schema._M_string_length = (args->schema)._M_string_length;
  paVar3 = &local_b8.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar1;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_b8.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar1 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.name._M_dataplus._M_p == paVar1) {
    local_b8.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8.name.field_2._8_8_ = *(undefined8 *)((long)&(args->name).field_2 + 8);
    local_b8.name._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b8.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b8.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar1;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_b8.if_not_found = args->if_not_found;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_d0,
           &args_1->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  pcVar4 = (args_2->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + args_2->_M_string_length);
  RenameFieldInfo::RenameFieldInfo(this_00,&local_b8,&local_d0,&local_50);
  *(RenameFieldInfo **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.schema._M_dataplus._M_p != &local_b8.schema.field_2) {
    operator_delete(local_b8.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}